

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O2

string * Disassembler::jType(string *__return_storage_ptr__,string *bin)

{
  bool bVar1;
  int iVar2;
  int line;
  uint line_00;
  string sStack_108;
  string label;
  string local_c8;
  string local_a8;
  string local_88;
  string op;
  string local_48;
  
  std::__cxx11::string::substr((ulong)&local_48,(ulong)bin);
  AsmFuncts::getOpCode(&op,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::to_string(&sStack_108,labelCount);
  std::operator+(&label,"LABEL_",&sStack_108);
  std::__cxx11::string::~string((string *)&sStack_108);
  std::__cxx11::string::substr((ulong)&local_88,(ulong)bin);
  iVar2 = Conversion::binToDec(&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  line_00 = iVar2 * 4 + -0x400000 >> 2;
  bVar1 = labelExists(line_00);
  if (bVar1) {
    std::operator+(&sStack_108,&op," ");
    getLabel_abi_cxx11_(&local_c8,(Disassembler *)(ulong)line_00,line);
    std::operator+(__return_storage_ptr__,&sStack_108,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,(string *)&label);
    addLabel(line_00,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::operator+(&sStack_108,&op," ");
    std::operator+(__return_storage_ptr__,&sStack_108,&label);
  }
  std::__cxx11::string::~string((string *)&sStack_108);
  std::__cxx11::string::~string((string *)&label);
  std::__cxx11::string::~string((string *)&op);
  return __return_storage_ptr__;
}

Assistant:

string Disassembler::jType(string bin){
    string op = AsmFuncts::getOpCode(bin.substr(0,6));
    string label = "LABEL_"+to_string(labelCount);
    int addr = Conversion::binToDec(bin.substr(6,26));
    addr <<= 2;
    int line = (addr-BASE)/4;
    if(!labelExists(line)){
      addLabel(line,label);
      return (op+" "+label);
    }
    else
      return (op+" "+getLabel(line));
}